

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O2

void StaticVarsDumpToFile(bool *result)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uStack_30;
  uint64_t staticMemSize;
  size_t staticMemCount;
  
  __static_mem_check(&staticMemCount,&staticMemSize,true,"staticvarsdump.log",false);
  iVar1 = countLinesInFile("staticvarsdump.log");
  if (iVar1 == 4) {
    __static_mem_check(&staticMemCount,&staticMemSize,true,"staticvarsdump.log",true);
    iVar1 = countLinesInFile("staticvarsdump.log");
    if (iVar1 != 8) {
      uVar2 = countLinesInFile("staticvarsdump.log");
      uVar3 = 0x58;
      uStack_30 = 8;
      goto LAB_001025f0;
    }
    __static_mem_check(&staticMemCount,&staticMemSize,true,"staticvarsdump.log",false);
    iVar1 = countLinesInFile("staticvarsdump.log");
    if (iVar1 == 4) {
      return;
    }
    uVar2 = countLinesInFile("staticvarsdump.log");
    uStack_30 = 0x5c;
  }
  else {
    uVar2 = countLinesInFile("staticvarsdump.log");
    uStack_30 = 0x54;
  }
  uVar3 = uStack_30;
  uStack_30 = 4;
LAB_001025f0:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarsDumpToFile",
         uVar3,(ulong)uVar2,uStack_30);
  *result = false;
  return;
}

Assistant:

TEST_CASE(StaticVarsDumpToFile) {

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", true);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 8);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);
}